

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O0

particle * __thiscall
spatial_region::bear_particle
          (spatial_region *this,double cmr,vector3d *position,vector3d *direction,double g,
          double chi,double q)

{
  particle *ppVar1;
  double *in_RDX;
  double *in_RSI;
  double in_XMM0_Qa;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  spatial_region *in_XMM1_Qa;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double in_XMM2_Qa;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double in_XMM3_Qa;
  undefined1 auVar13 [16];
  double a;
  particle *p;
  double local_48;
  
  ppVar1 = new_particle(in_XMM1_Qa);
  ppVar1->cmr = in_XMM0_Qa;
  ppVar1->q = in_XMM3_Qa;
  ppVar1->g = (double)in_XMM1_Qa;
  ppVar1->chi = in_XMM2_Qa;
  ppVar1->x = *in_RSI;
  ppVar1->y = in_RSI[1];
  ppVar1->z = in_RSI[2];
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = in_XMM1_Qa;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = in_XMM1_Qa;
    auVar4 = vfmadd213sd_fma(auVar4,auVar7,ZEXT816(0xbff0000000000000));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *in_RDX;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *in_RDX;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = in_RDX[1] * in_RDX[1];
    auVar7 = vfmadd213sd_fma(auVar13,auVar8,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = in_RDX[2];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = in_RDX[2];
    auVar7 = vfmadd213sd_fma(auVar9,auVar12,auVar7);
    local_48 = sqrt(auVar4._0_8_ / auVar7._0_8_);
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *in_RDX;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *in_RDX;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = in_RDX[1] * in_RDX[1];
    auVar4 = vfmadd213sd_fma(auVar10,auVar2,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = in_RDX[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_RDX[2];
    auVar4 = vfmadd213sd_fma(auVar3,auVar6,auVar4);
    local_48 = sqrt(auVar4._0_8_);
    local_48 = (double)in_XMM1_Qa / local_48;
  }
  ppVar1->ux = local_48 * *in_RDX;
  ppVar1->uy = local_48 * in_RDX[1];
  ppVar1->uz = local_48 * in_RDX[2];
  ppVar1->trn = 0;
  return ppVar1;
}

Assistant:

particle* spatial_region::bear_particle(double cmr, vector3d& position, vector3d& direction, double g, double chi, double q)
{
    particle* p;
    double a;
    p = new_particle();
    p->cmr = cmr;
    p->q = q;
    p->g = g;
    p->chi = chi;
    p->x = position.x;
    p->y = position.y;
    p->z = position.z;
    if (cmr==0)
        a = g/sqrt(direction.x*direction.x + direction.y*direction.y + direction.z*direction.z);
    else
        a = sqrt((g*g-1)/(direction.x*direction.x + direction.y*direction.y + direction.z*direction.z));
    p->ux = a*direction.x;
    p->uy = a*direction.y;
    p->uz = a*direction.z;
    p->trn = 0;
    return p;
}